

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  FieldDescriptor *pFVar1;
  OneofDescriptor *pOVar2;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  ExtensionRange *pEVar5;
  FieldDescriptorProto *pFVar6;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *proto_03;
  long lVar7;
  long lVar8;
  
  CopyHeadingTo(this,proto);
  if (0 < this->field_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pFVar1 = this->fields_;
      pFVar6 = (FieldDescriptorProto *)
               internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
      FieldDescriptor::CopyTo((FieldDescriptor *)(&pFVar1->super_SymbolBase + lVar8),pFVar6);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar7 < this->field_count_);
  }
  if (0 < this->oneof_decl_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pOVar2 = this->oneof_decls_;
      proto_00 = (OneofDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
      OneofDescriptor::CopyTo((OneofDescriptor *)(&pOVar2->super_SymbolBase + lVar8),proto_00);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x38;
    } while (lVar7 < this->oneof_decl_count_);
  }
  if (0 < this->nested_type_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pDVar3 = this->nested_types_;
      proto_01 = (DescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      CopyTo((Descriptor *)(&pDVar3->super_SymbolBase + lVar8),proto_01);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xa0;
    } while (lVar7 < this->nested_type_count_);
  }
  if (0 < this->enum_type_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pEVar4 = this->enum_types_;
      proto_02 = (EnumDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
      EnumDescriptor::CopyTo((EnumDescriptor *)(&pEVar4->super_SymbolBase + lVar8),proto_02);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar7 < this->enum_type_count_);
  }
  if (0 < this->extension_range_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pEVar5 = this->extension_ranges_;
      proto_03 = (DescriptorProto_ExtensionRange *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                            Arena::
                            DefaultConstruct<google::protobuf::DescriptorProto_ExtensionRange>);
      ExtensionRange::CopyTo((ExtensionRange *)((long)&pEVar5->start_ + lVar8),proto_03);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x28;
    } while (lVar7 < this->extension_range_count_);
  }
  if (0 < this->extension_count_) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pFVar1 = this->extensions_;
      pFVar6 = (FieldDescriptorProto *)
               internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
      FieldDescriptor::CopyTo((FieldDescriptor *)(&pFVar1->super_SymbolBase + lVar8),pFVar6);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar7 < this->extension_count_);
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}